

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_hom.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_hom::save(xr_level_hom *this,xr_writer *w)

{
  xr_writer *w_local;
  xr_level_hom *this_local;
  
  xr_writer::w_chunk<unsigned_int>(w,0,&HOM_VERSION);
  xr_writer::open_chunk(w,1);
  xr_writer::w_cseq<xray_re::hom_poly>(w,(ulong)this->m_num_polys,this->m_polys);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_level_hom::save(xr_writer& w) const
{
	w.w_chunk<uint32_t>(HOM_CHUNK_VERSION, HOM_VERSION);
	w.open_chunk(HOM_CHUNK_POLYGONS);
	w.w_cseq(m_num_polys, m_polys);
	w.close_chunk();
}